

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O3

void ihevc_sao_edge_offset_class1_chroma
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,UWORD8 *pu1_src_top_right,UWORD8 *pu1_src_bot_left,
               UWORD8 *pu1_avail,WORD8 *pi1_sao_offset_u,WORD8 *pi1_sao_offset_v,WORD32 wd,WORD32 ht
               )

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  long lVar5;
  UWORD8 *pUVar6;
  UWORD8 *pUVar7;
  int iVar8;
  ulong uVar9;
  WORD8 *pWVar10;
  int iVar11;
  byte bVar12;
  WORD8 au1_sign_up [64];
  UWORD8 au1_src_top_tmp [64];
  byte local_f8 [128];
  undefined1 local_78 [72];
  
  local_f8[0] = 0xff;
  local_f8[1] = 0xff;
  local_f8[2] = 0xff;
  local_f8[3] = 0xff;
  local_f8[4] = 0xff;
  local_f8[5] = 0xff;
  local_f8[6] = 0xff;
  local_f8[7] = 0xff;
  local_f8[8] = 0xff;
  local_f8[9] = 0xff;
  local_f8[10] = 0xff;
  local_f8[0xb] = 0xff;
  local_f8[0xc] = 0xff;
  local_f8[0xd] = 0xff;
  local_f8[0xe] = 0xff;
  local_f8[0xf] = 0xff;
  local_f8[0x10] = 0xff;
  local_f8[0x11] = 0xff;
  local_f8[0x12] = 0xff;
  local_f8[0x13] = 0xff;
  local_f8[0x14] = 0xff;
  local_f8[0x15] = 0xff;
  local_f8[0x16] = 0xff;
  local_f8[0x17] = 0xff;
  local_f8[0x18] = 0xff;
  local_f8[0x19] = 0xff;
  local_f8[0x1a] = 0xff;
  local_f8[0x1b] = 0xff;
  local_f8[0x1c] = 0xff;
  local_f8[0x1d] = 0xff;
  local_f8[0x1e] = 0xff;
  local_f8[0x1f] = 0xff;
  local_f8[0x20] = 0xff;
  local_f8[0x21] = 0xff;
  local_f8[0x22] = 0xff;
  local_f8[0x23] = 0xff;
  local_f8[0x24] = 0xff;
  local_f8[0x25] = 0xff;
  local_f8[0x26] = 0xff;
  local_f8[0x27] = 0xff;
  local_f8[0x28] = 0xff;
  local_f8[0x29] = 0xff;
  local_f8[0x2a] = 0xff;
  local_f8[0x2b] = 0xff;
  local_f8[0x2c] = 0xff;
  local_f8[0x2d] = 0xff;
  local_f8[0x2e] = 0xff;
  local_f8[0x2f] = 0xff;
  local_f8[0x30] = 0xff;
  local_f8[0x31] = 0xff;
  local_f8[0x32] = 0xff;
  local_f8[0x33] = 0xff;
  local_f8[0x34] = 0xff;
  local_f8[0x35] = 0xff;
  local_f8[0x36] = 0xff;
  local_f8[0x37] = 0xff;
  local_f8[0x38] = 0xff;
  local_f8[0x39] = 0xff;
  local_f8[0x3a] = 0xff;
  local_f8[0x3b] = 0xff;
  local_f8[0x3c] = 0xff;
  local_f8[0x3d] = 0xff;
  local_f8[0x3e] = 0xff;
  local_f8[0x3f] = 0xff;
  lVar5 = (long)wd;
  *pu1_src_top_left = pu1_src_top[lVar5 + -2];
  pu1_src_top_left[1] = pu1_src_top[lVar5 + -1];
  if (0 < ht) {
    pUVar6 = pu1_src + lVar5 + -1;
    uVar9 = 0;
    do {
      pu1_src_left[uVar9 * 2] = pUVar6[-1];
      pu1_src_left[uVar9 * 2 + 1] = *pUVar6;
      uVar9 = uVar9 + 1;
      pUVar6 = pUVar6 + src_strd;
    } while ((uint)ht != uVar9);
  }
  uVar9 = (ulong)(uint)wd;
  pUVar6 = pu1_src;
  if (wd < 1) {
    if (pu1_avail[2] == '\0') {
      pUVar6 = pu1_src + src_strd;
      ht = ht + -1;
    }
  }
  else {
    iVar11 = ht + -1;
    memcpy(local_78,pu1_src + iVar11 * src_strd,uVar9);
    if (pu1_avail[2] == '\0') {
      uVar1 = 0;
      do {
        bVar4 = (pu1_src + src_strd)[uVar1];
        bVar12 = bVar4 != pu1_src[uVar1];
        if (bVar4 < pu1_src[uVar1]) {
          bVar12 = 0xff;
        }
        local_f8[uVar1 + 0x40] = bVar12;
        uVar1 = uVar1 + 1;
        pUVar6 = pu1_src + src_strd;
        ht = iVar11;
      } while (uVar9 != uVar1);
    }
    else {
      uVar1 = 0;
      do {
        bVar4 = pu1_src[uVar1] != pu1_src_top[uVar1];
        if (pu1_src[uVar1] < pu1_src_top[uVar1]) {
          bVar4 = 0xff;
        }
        local_f8[uVar1 + 0x40] = bVar4;
        uVar1 = uVar1 + 1;
      } while (uVar9 != uVar1);
    }
  }
  iVar11 = ht - (uint)(pu1_avail[3] == '\0');
  if (0 < iVar11) {
    iVar8 = 0;
    pUVar7 = pUVar6;
    do {
      pUVar7 = pUVar7 + src_strd;
      if (0 < wd) {
        uVar1 = 0;
        do {
          bVar4 = pUVar6[uVar1];
          uVar2 = (uint)(bVar4 != pUVar7[uVar1]);
          if (bVar4 < pUVar7[uVar1]) {
            uVar2 = 0xffffffff;
          }
          bVar12 = local_f8[uVar1 + 0x40];
          local_f8[uVar1 + 0x40] = -(char)uVar2;
          if (((uint)local_f8[uVar1 >> 1 & 0x7fffffff] &
              gi4_ihevc_table_edge_idx[(long)(char)bVar12 + (long)(int)uVar2 + 2]) != 0) {
            pWVar10 = pi1_sao_offset_v;
            if ((uVar1 & 1) == 0) {
              pWVar10 = pi1_sao_offset_u;
            }
            iVar3 = (int)pWVar10[(uint)local_f8[uVar1 >> 1 & 0x7fffffff] &
                                 gi4_ihevc_table_edge_idx[(long)(char)bVar12 + (long)(int)uVar2 + 2]
                                ] + (uint)bVar4;
            if (iVar3 < 1) {
              iVar3 = 0;
            }
            if (0xfe < iVar3) {
              iVar3 = 0xff;
            }
            pUVar6[uVar1] = (UWORD8)iVar3;
          }
          uVar1 = uVar1 + 1;
        } while (uVar9 != uVar1);
      }
      pUVar6 = pUVar6 + src_strd;
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar11);
  }
  if (0 < wd) {
    memcpy(pu1_src_top,local_78,uVar9);
  }
  return;
}

Assistant:

void ihevc_sao_edge_offset_class1_chroma(UWORD8 *pu1_src,
                                         WORD32 src_strd,
                                         UWORD8 *pu1_src_left,
                                         UWORD8 *pu1_src_top,
                                         UWORD8 *pu1_src_top_left,
                                         UWORD8 *pu1_src_top_right,
                                         UWORD8 *pu1_src_bot_left,
                                         UWORD8 *pu1_avail,
                                         WORD8 *pi1_sao_offset_u,
                                         WORD8 *pi1_sao_offset_v,
                                         WORD32 wd,
                                         WORD32 ht)
{
    WORD32 row, col;
    UWORD8 au1_mask[MAX_CTB_SIZE];
    UWORD8 au1_src_top_tmp[MAX_CTB_SIZE];
    WORD8 au1_sign_up[MAX_CTB_SIZE];
    WORD8 u1_sign_down;
    WORD32 bit_depth;
    UNUSED(pu1_src_top_right);
    UNUSED(pu1_src_bot_left);

    bit_depth = BIT_DEPTH_CHROMA;

    /* Initialize the mask values */
    memset(au1_mask, 0xFF, MAX_CTB_SIZE);

    /* Update left, top and top-left arrays */
    pu1_src_top_left[0] = pu1_src_top[wd - 2];
    pu1_src_top_left[1] = pu1_src_top[wd - 1];
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[2 * row] = pu1_src[row * src_strd + wd - 2];
        pu1_src_left[2 * row + 1] = pu1_src[row * src_strd + wd - 1];
    }
    for(col = 0; col < wd; col++)
    {
        au1_src_top_tmp[col] = pu1_src[(ht - 1) * src_strd + col];
    }

    /* Update height and source pointers based on the availability flags */
    if(0 == pu1_avail[2])
    {
        pu1_src += src_strd;
        ht--;
        for(col = 0; col < wd; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src[col - src_strd]);
        }
    }
    else
    {
        for(col = 0; col < wd; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src_top[col]);
        }
    }
    if(0 == pu1_avail[3])
    {
        ht--;
    }

    /* Processing is done on the intermediate buffer and the output is written to the source buffer */
    {
        for(row = 0; row < ht; row++)
        {
            for(col = 0; col < wd; col++)
            {
                WORD32 edge_idx;
                WORD8 *pi1_sao_offset;

                pi1_sao_offset = (0 == col % 2) ? pi1_sao_offset_u : pi1_sao_offset_v;

                u1_sign_down = SIGN(pu1_src[col] - pu1_src[col + src_strd]);
                edge_idx = 2 + au1_sign_up[col] + u1_sign_down;
                au1_sign_up[col] = -u1_sign_down;

                edge_idx = gi4_ihevc_table_edge_idx[edge_idx] & au1_mask[col >> 1];

                if(0 != edge_idx)
                {
                    pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
                }
            }

            pu1_src += src_strd;
        }
    }

    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = au1_src_top_tmp[col];
    }

}